

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

bool __thiscall
Lib::Set<Kernel::Variable,_Lib::StlHash>::contains
          (Set<Kernel::Variable,_Lib::StlHash> *this,SymbolId val)

{
  bool bVar1;
  Cell *this_00;
  Set<Kernel::Variable,_Lib::StlHash> *in_RDI;
  Cell *cell;
  uint code;
  SymbolId *in_stack_ffffffffffffffe0;
  uint local_14;
  
  local_14 = StlHash::hash<Kernel::Variable>(in_stack_ffffffffffffffe0);
  if (local_14 < 2) {
    local_14 = 2;
  }
  this_00 = firstCellForCode(in_RDI,local_14);
  while( true ) {
    bVar1 = Cell::empty(this_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    bVar1 = Cell::deleted(this_00);
    if (((!bVar1) && (this_00->code == local_14)) &&
       (bVar1 = StlHash::equals<Kernel::Variable>((SymbolId *)this_00,(SymbolId *)in_RDI), bVar1))
    break;
    this_00 = nextCell(in_RDI,this_00);
  }
  return true;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }